

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void fasttext::averageRowsFast<16u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  undefined1 (*pauVar1) [64];
  float *pfVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int *piVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  
  auVar9 = in_ZMM0._0_16_;
  pauVar1 = (undefined1 (*) [64])(x->data_).mem_;
  if (((ulong)pauVar1 & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 16U]"
                 );
  }
  pfVar2 = (matrix->data_).mem_;
  if (((ulong)pfVar2 & 0x3f) == 0) {
    piVar3 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar4 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar3 != piVar4) {
      lVar5 = (matrix->super_Matrix).n_;
      auVar7 = *(undefined1 (*) [64])(pfVar2 + *piVar3 * lVar5);
      piVar6 = piVar3;
      while (piVar6 = piVar6 + 1, piVar6 != piVar4) {
        auVar7 = vaddps_avx512f(auVar7,*(undefined1 (*) [64])(pfVar2 + *piVar6 * lVar5));
      }
      auVar9 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,(long)piVar4 - (long)piVar3 >> 2);
      auVar9._0_8_ = 1.0 / auVar9._0_8_;
      auVar9._8_8_ = 0x3ff0000000000000;
      auVar10._0_4_ = (float)auVar9._0_8_;
      auVar10._4_12_ = auVar9._4_12_;
      auVar8 = vbroadcastss_avx512f(auVar10);
      auVar7 = vmulps_avx512f(auVar8,auVar7);
      *pauVar1 = auVar7;
      return;
    }
    Vector::zero(x);
    auVar9 = vcvtusi2sd_avx512f(auVar9,(long)(rows->super__Vector_base<int,_std::allocator<int>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(rows->super__Vector_base<int,_std::allocator<int>_>).
                                             _M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(x,(float)(1.0 / auVar9._0_8_));
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0xb4,
                "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 16U]"
               );
}

Assistant:

void DenseMatrix::divideRow(const Vector& denoms, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= denoms.size());
  for (auto i = ib; i < ie; i++) {
    real n = denoms[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) /= n;
      }
    }
  }
}